

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputCheck.h
# Opt level: O1

int InputCheck(string *getLevelNumber)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)getLevelNumber);
  if (iVar1 != 0) {
    iVar1 = atoi((getLevelNumber->_M_dataplus)._M_p);
    return iVar1;
  }
  exit(1);
}

Assistant:

int InputCheck(std::string getLevelNumber)
{
    int Number = 0;
    if (getLevelNumber == "exit") {
        exit(1);
    }
    if (atoi(getLevelNumber.c_str()) == 0) {

        return 0;
    }
    Number = atoi(getLevelNumber.c_str()); //

    return Number;
}